

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execTasEa<(moira::Instr)124,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  ulong in_RAX;
  u32 data;
  u32 ea;
  
  _data = in_RAX;
  (*this->_vptr_Moira[0xb])();
  readOp<(moira::Mode)2,(moira::Size)1,0ul>(this,opcode & 7,&ea,&data);
  (this->reg).sr.n = (bool)((byte)_data >> 7);
  (this->reg).sr.z = (byte)_data == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  _data = _data | 0x80;
  (*this->_vptr_Moira[0x19])(this,2);
  writeM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,ea,data);
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execTasEa(u16 opcode)
{
    signalTAS();

    int dst = ( _____________xxx(opcode) );

    u32 ea, data;
    readOp<M,Byte>(dst, ea, data);

    reg.sr.n = NBIT<Byte>(data);
    reg.sr.z = ZERO<Byte>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
    data |= 0x80;

    if (!isRegMode(M)) sync(2);
    writeOp <M,S> (dst, ea, data);

    prefetch<POLLIPL>();
}